

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

string * __thiscall
pbrt::PiecewiseLinearSpectrum::ToString_abi_cxx11_(PiecewiseLinearSpectrum *this)

{
  ulong uVar1;
  size_t sVar2;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_RSI;
  string *in_RDI;
  size_t i;
  string ret;
  string name;
  PiecewiseLinearSpectrum *in_stack_ffffffffffffff28;
  Spectrum *in_stack_ffffffffffffff30;
  allocator<char> *args_1;
  string *__lhs;
  char *in_stack_ffffffffffffff68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  size_type local_78;
  allocator<char> local_69;
  Spectrum *in_stack_ffffffffffffff98;
  string local_30 [48];
  
  __lhs = in_RDI;
  Spectrum::TaggedPointer<pbrt::PiecewiseLinearSpectrum_const>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  FindMatchingNamedSpectrum_abi_cxx11_(in_stack_ffffffffffffff98);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    StringPrintf<std::__cxx11::string&>((char *)__lhs,in_RDI);
  }
  else {
    args_1 = &local_69;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(allocator<char> *)in_RSI);
    std::allocator<char>::~allocator(&local_69);
    local_78 = 0;
    while( true ) {
      sVar2 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RSI);
      if (sVar2 <= local_78) break;
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[](in_RSI,local_78);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[](in_RSI + 1,local_78)
      ;
      StringPrintf<float_const&,float_const&>((char *)__lhs,(float *)in_RDI,(float *)args_1);
      std::__cxx11::string::operator+=
                ((string *)&stack0xffffffffffffff98,(string *)&stack0xffffffffffffff68);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
      local_78 = local_78 + 1;
    }
    std::operator+(__lhs,(char *)in_RDI);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  }
  std::__cxx11::string::~string(local_30);
  return __lhs;
}

Assistant:

std::string PiecewiseLinearSpectrum::ToString() const {
    std::string name = FindMatchingNamedSpectrum(this);
    if (!name.empty())
        return StringPrintf("\"%s\"", name);

    std::string ret = "[ PiecewiseLinearSpectrum ";
    for (size_t i = 0; i < lambdas.size(); ++i)
        ret += StringPrintf("%f %f ", lambdas[i], values[i]);
    return ret + " ]";
}